

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateStackLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  bool bVar1;
  int iVar2;
  StackLayerParams *this_00;
  Tensor *pTVar3;
  string *psVar4;
  int64_t iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string err_1;
  undefined1 local_70 [8];
  string err;
  int rank1;
  int rank0;
  StackLayerParams *params;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,2,-1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      this_00 = Specification::NeuralNetworkLayer::stack(layer);
      iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
      if (0 < iVar2) {
        pTVar3 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
        err.field_2._12_4_ = Specification::Tensor::rank(pTVar3);
        pTVar3 = Specification::NeuralNetworkLayer::inputtensor(layer,1);
        err.field_2._8_4_ = Specification::Tensor::rank(pTVar3);
        if (err.field_2._12_4_ != err.field_2._8_4_) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          __return_storage_ptr___00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_1.field_2 + 8);
          std::operator+(__return_storage_ptr___00,"Shapes of all inputs must match for \'",psVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,__return_storage_ptr___00,"\' layer.");
          std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
          std::__cxx11::string::~string((string *)local_70);
          return __return_storage_ptr__;
        }
        iVar5 = Specification::StackLayerParams::axis(this_00);
        if ((iVar5 < -(err.field_2._12_4_ + 1)) ||
           (iVar5 = Specification::StackLayerParams::axis(this_00), err.field_2._12_4_ + 1 <= iVar5)
           ) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::operator+(&local_d0,
                         "Value of axis must be in the range [-rank(tensor), rank(tensor)] for \'",
                         psVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,&local_d0,"\' layer.");
          std::__cxx11::string::~string((string *)&local_d0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
          std::__cxx11::string::~string((string *)local_b0);
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateStackLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, -1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.stack();
    if (layer.inputtensor_size() > 0) {
        const int rank0 = static_cast<int>(layer.inputtensor(0).rank());
        const int rank1 = static_cast<int>(layer.inputtensor(1).rank());
        if (rank0 != rank1) {
            const std::string err = "Shapes of all inputs must match for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!(params.axis() >= -(rank0 + 1) && params.axis() < rank0 + 1)) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)] for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}